

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  grasshopper_w128_t *y;
  ulong in_RCX;
  grasshopper_w128_t *in_RDX;
  grasshopper_w128_t *in_RSI;
  undefined8 in_RDI;
  grasshopper_w128_t tmp;
  grasshopper_w128_t *currentOutputBlock;
  grasshopper_w128_t *currentInputBlock;
  grasshopper_w128_t *currentBlock;
  size_t i;
  size_t blocks;
  uchar *current_out;
  uchar *current_in;
  _Bool encrypting;
  uchar *iv;
  gost_grasshopper_cipher_ctx *c;
  grasshopper_w128_t *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  grasshopper_w128_t *pgVar2;
  ulong local_58;
  grasshopper_w128_t *local_48;
  grasshopper_w128_t *local_40;
  
  EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  y = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
  local_48 = in_RSI;
  local_40 = in_RDX;
  for (local_58 = 0; local_58 < in_RCX >> 4; local_58 = local_58 + 1) {
    if (iVar1 == 0) {
      pgVar2 = local_48;
      grasshopper_copy128((grasshopper_w128_t *)&stack0xffffffffffffff80,local_40);
      grasshopper_decrypt_block
                ((grasshopper_round_keys_t *)pgVar2,(grasshopper_w128_t *)in_stack_ffffffffffffff88,
                 (grasshopper_w128_t *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      grasshopper_append128(pgVar2,y);
      grasshopper_copy128(y,(grasshopper_w128_t *)&stack0xffffffffffffff80);
    }
    else {
      pgVar2 = local_48;
      grasshopper_append128(y,local_40);
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)pgVar2,(grasshopper_w128_t *)in_stack_ffffffffffffff88,
                 (grasshopper_w128_t *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      grasshopper_copy128(y,pgVar2);
    }
    local_40 = local_40 + 1;
    local_48 = local_48 + 1;
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    size_t blocks = inl / GRASSHOPPER_BLOCK_SIZE;
    size_t i;
    grasshopper_w128_t *currentBlock;

    currentBlock = (grasshopper_w128_t *) iv;

    for (i = 0; i < blocks;
         i++, current_in += GRASSHOPPER_BLOCK_SIZE, current_out +=
         GRASSHOPPER_BLOCK_SIZE) {
        grasshopper_w128_t *currentInputBlock = (grasshopper_w128_t *) current_in;
        grasshopper_w128_t *currentOutputBlock = (grasshopper_w128_t *) current_out;
        if (encrypting) {
            grasshopper_append128(currentBlock, currentInputBlock);
            grasshopper_encrypt_block(&c->encrypt_round_keys, currentBlock,
                                      currentOutputBlock, &c->buffer);
            grasshopper_copy128(currentBlock, currentOutputBlock);
        } else {
            grasshopper_w128_t tmp;

            grasshopper_copy128(&tmp, currentInputBlock);
            grasshopper_decrypt_block(&c->decrypt_round_keys,
                                      currentInputBlock, currentOutputBlock,
                                      &c->buffer);
            grasshopper_append128(currentOutputBlock, currentBlock);
            grasshopper_copy128(currentBlock, &tmp);
        }
    }

    return 1;
}